

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.hpp
# Opt level: O1

void __thiscall OpenMD::MAW::~MAW(MAW *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer piVar3;
  
  (this->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__MAW_003003a0;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&(this->simTypes_)._M_t);
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::~vector(&this->MixingMap);
  piVar3 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->MAWtids).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->MAWtypes)._M_t);
  operator_delete(this,200);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }